

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *o,Molecule *mol)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  Molecule *in_RSI;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"Molecule ");
  iVar1 = Molecule::getGlobalIndex(in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"has: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNAtoms((Molecule *)0x23bf7b);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," atoms");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNBonds((Molecule *)0x23bfba);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," bonds");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNBends((Molecule *)0x23bff9);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," bends");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNTorsions((Molecule *)0x23c038);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," torsions");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNInversions((Molecule *)0x23c077);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," inversions");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNRigidBodies((Molecule *)0x23c0b6);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," rigid bodies");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNIntegrableObjects((Molecule *)0x23c0f5);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," integrable objects");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNCutoffGroups((Molecule *)0x23c134);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," cutoff groups");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNConstraintPairs((Molecule *)0x23c173);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," constraint pairs");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = Molecule::getNFluctuatingCharges((Molecule *)0x23c1b2);
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,sVar3);
  poVar2 = std::operator<<(poVar2," fluctuating charges");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Molecule& mol) {
    o << std::endl;
    o << "Molecule " << mol.getGlobalIndex() << "has: " << std::endl;
    o << mol.getNAtoms() << " atoms" << std::endl;
    o << mol.getNBonds() << " bonds" << std::endl;
    o << mol.getNBends() << " bends" << std::endl;
    o << mol.getNTorsions() << " torsions" << std::endl;
    o << mol.getNInversions() << " inversions" << std::endl;
    o << mol.getNRigidBodies() << " rigid bodies" << std::endl;
    o << mol.getNIntegrableObjects() << " integrable objects" << std::endl;
    o << mol.getNCutoffGroups() << " cutoff groups" << std::endl;
    o << mol.getNConstraintPairs() << " constraint pairs" << std::endl;
    o << mol.getNFluctuatingCharges() << " fluctuating charges" << std::endl;
    return o;
  }